

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O0

bool __thiscall CCoinsViewDB::NeedsUpgrade(CCoinsViewDB *this)

{
  long lVar1;
  byte bVar2;
  CDBIterator *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> cursor;
  CDBIterator *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *this_00;
  pair<unsigned_char,_uint256> *in_stack_ffffffffffffff90;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> local_60;
  CDBWrapper *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_ffffffffffffff68);
  CDBWrapper::NewIterator(in_stack_ffffffffffffffa8);
  this_00 = &local_60;
  std::unique_ptr<CDBIterator,std::default_delete<CDBIterator>>::
  unique_ptr<std::default_delete<CDBIterator>,void>
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffff68
             ,(pointer)0x141b7b9);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffff68
            );
  uint256::uint256((uint256 *)in_stack_ffffffffffffff68);
  std::make_pair<unsigned_char_const&,uint256>
            ((uchar *)this_00,
             (uint256 *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  CDBIterator::Seek<std::pair<unsigned_char,uint256>>(in_RDI,in_stack_ffffffffffffff90);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::operator->
            ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)in_stack_ffffffffffffff68
            );
  bVar2 = CDBIterator::Valid(in_stack_ffffffffffffff68);
  std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewDB::NeedsUpgrade()
{
    std::unique_ptr<CDBIterator> cursor{m_db->NewIterator()};
    // DB_COINS was deprecated in v0.15.0, commit
    // 1088b02f0ccd7358d2b7076bb9e122d59d502d02
    cursor->Seek(std::make_pair(DB_COINS, uint256{}));
    return cursor->Valid();
}